

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestList
               (ostream *stream,
               vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  undefined8 this;
  bool bVar1;
  int iVar2;
  reference ppTVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference ppTVar6;
  size_t width;
  ulong local_118;
  size_t i;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  TestSuite *local_98;
  TestSuite *test_suite;
  const_iterator __end2;
  const_iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  undefined1 local_70 [4];
  int total_tests;
  string kIndent;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string kTestsuites;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites_local;
  ostream *stream_local;
  
  kTestsuites.field_2._8_8_ = test_suites;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"testsuites",&local_39);
  std::allocator<char>::~allocator(&local_39);
  Indent_abi_cxx11_((string *)local_70,(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  this = kTestsuites.field_2._8_8_;
  __range2._4_4_ = 0;
  __end2 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                     ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                      kTestsuites.field_2._8_8_);
  test_suite = (TestSuite *)
               std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                         ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                          this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                                *)&test_suite);
    if (!bVar1) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&__end2);
    local_98 = *ppTVar3;
    iVar2 = TestSuite::total_test_count(local_98);
    __range2._4_4_ = iVar2 + __range2._4_4_;
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&__end2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"tests",&local_b9);
  OutputJsonKey(stream,(string *)local_38,&local_b8,__range2._4_4_,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"name",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"AllTests",(allocator<char> *)((long)&i + 7));
  OutputJsonKey(stream,(string *)local_38,&local_e0,&local_108,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  poVar4 = std::operator<<(stream,(string *)local_70);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,(string *)local_38);
  std::operator<<(poVar4,"\": [\n");
  local_118 = 0;
  while( true ) {
    sVar5 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::size
                      ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                       kTestsuites.field_2._8_8_);
    if (sVar5 <= local_118) break;
    if (local_118 != 0) {
      std::operator<<(stream,",\n");
    }
    ppTVar6 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::operator[]
                        ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                         kTestsuites.field_2._8_8_,local_118);
    PrintJsonTestSuite(stream,*ppTVar6);
    local_118 = local_118 + 1;
  }
  poVar4 = std::operator<<(stream,"\n");
  poVar4 = std::operator<<(poVar4,(string *)local_70);
  poVar4 = std::operator<<(poVar4,"]\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestList(
    std::ostream* stream, const std::vector<TestSuite*>& test_suites) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";
  int total_tests = 0;
  for (auto test_suite : test_suites) {
    total_tests += test_suite->total_test_count();
  }
  OutputJsonKey(stream, kTestsuites, "tests", total_tests, kIndent);

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  for (size_t i = 0; i < test_suites.size(); ++i) {
    if (i != 0) {
      *stream << ",\n";
    }
    PrintJsonTestSuite(stream, *test_suites[i]);
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}